

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::GetPendingDataset
          (CommissionerImpl *this,Handler<PendingOperationalDataset> *aHandler,
          uint16_t aDatasetFlags)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  Error *pEVar4;
  function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  *this_00;
  char *pcVar5;
  char *pcVar6;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  undefined1 local_1e8 [8];
  char *local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  parse_func local_1c0 [1];
  writer write;
  undefined1 local_1b0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  string local_188;
  ByteArray datasetList;
  Error error;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&request,kConfirmable,kPost);
  GetPendingOperationalDatasetTlvs(&datasetList,aDatasetFlags);
  std::function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  ::function(&onResponse.aHandler,aHandler);
  if ((this->mState & ~kPetitioning) == kConnected) {
    std::__cxx11::string::string((string *)local_1b0,"/c/pg",(allocator *)&local_188);
    coap::Message::SetUriPath((Error *)local_1e8,&request,(string *)local_1b0);
    pEVar4 = Error::operator=(&error,(Error *)local_1e8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (EVar2 != kNone) goto LAB_00195a71;
    if (datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)local_1b0,kGet,&datasetList,kMeshCoP);
      AppendTlv((Error *)local_1e8,&request,(Tlv *)local_1b0);
      pEVar4 = Error::operator=(&error,(Error *)local_1e8);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&local_1e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
      if (EVar2 != kNone) goto LAB_00195a71;
    }
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_1e8,this,&request,kMeshCoP,true);
      pEVar4 = Error::operator=(&error,(Error *)local_1e8);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&local_1e0);
      if (EVar2 != kNone) goto LAB_00195a71;
    }
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    this_00 = (function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
               *)operator_new(0x20);
    std::
    function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>::
    function(this_00,&onResponse.aHandler);
    pcStack_110 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:580:23)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:580:23)>
                ::_M_manager;
    local_128._M_unused._M_object = this_00;
    coap::CoapSecure::SendRequest(&this->mBrClient,&request,(ResponseHandler *)&local_128);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__cxx11::string::string((string *)local_1b0,"mgmt",(allocator *)&write);
    local_1e8._0_4_ = none_type;
    local_1e0 = "sent MGMT_PENDING_GET.req";
    local_1d8 = 0x19;
    local_1d0._M_allocated_capacity = 0;
    local_1c0[0] = (parse_func)0x0;
    pcVar5 = "sent MGMT_PENDING_GET.req";
    local_1d0._8_8_ = local_1e8;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1e8);
      }
    }
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_1e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_188,(v10 *)"sent MGMT_PENDING_GET.req",(string_view)ZEXT816(0x19),args_00);
    Log(kDebug,(string *)local_1b0,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    this_01 = (string *)local_1b0;
  }
  else {
    local_1e8._0_4_ = none_type;
    local_1e0 = "the commissioner is not active or secure session is not connected";
    local_1d8 = 0x41;
    local_1d0._M_allocated_capacity = 0;
    local_1c0[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active or secure session is not connected";
    local_1d0._8_8_ = local_1e8;
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_1e8;
    while (pcVar5 != "") {
      cVar1 = *pcVar5;
      pcVar6 = pcVar5;
      while (cVar1 != '{') {
        pcVar6 = pcVar6 + 1;
        if (pcVar6 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar5,"");
          goto LAB_00195a1a;
        }
        cVar1 = *pcVar6;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar5,pcVar6);
      pcVar5 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1e8);
    }
LAB_00195a1a:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_188,(v10 *)"the commissioner is not active or secure session is not connected"
               ,(string_view)ZEXT816(0x41),args);
    local_1b0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_1a8,(string *)&local_188);
    Error::operator=(&error,(Error *)local_1b0);
    std::__cxx11::string::~string((string *)&local_1a8);
    this_01 = &local_188;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00195a71:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::
    function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>::
    operator()(aHandler,(PendingOperationalDataset *)0x0,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&datasetList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  coap::Message::~Message(&request);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::GetPendingDataset(Handler<PendingOperationalDataset> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     datasetList = GetPendingOperationalDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error                     error;
        PendingOperationalDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodePendingOperationalDataset(dataset, *aResponse));
        if (dataset.mPresentFlags != 0)
        {
            VerifyOrExit(dataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit,
                         error = ERROR_BAD_FORMAT("Delay Timer is not included in MGMT_PENDING_GET.rsp"));
        }

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    VerifyOrExit(IsActiveOrConnected(),
                 error = ERROR_INVALID_STATE("the commissioner is not active or secure session is not connected"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtPendingGet));
    if (!datasetList.empty())
    {
        SuccessOrExit(error = AppendTlv(request, {tlv::Type::kGet, datasetList}));
    }

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mBrClient.SendRequest(request, onResponse);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_PENDING_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}